

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::ReloadPub(World *this,bool quiet)

{
  EIF *this_00;
  ENF *this_01;
  ESF *this_02;
  ECF *this_03;
  Character *pCVar1;
  bool bVar2;
  mapped_type *pmVar3;
  reference ppCVar4;
  size_type __new_size;
  reference this_04;
  pointer this_05;
  size_type local_1e0;
  size_t i;
  size_t new_npcs;
  size_t current_npcs;
  string local_1c0 [32];
  Character *local_1a0;
  Character *character;
  iterator __end3;
  iterator __begin3;
  vector<Character_*,_std::allocator<Character_*>_> *__range3;
  key_type local_178;
  string local_158;
  allocator<char> local_131;
  key_type local_130;
  string local_110;
  allocator<char> local_e9;
  key_type local_e8;
  string local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  string local_80;
  allocator<char> local_49;
  key_type local_48;
  byte local_25;
  array<unsigned_char,_4UL> local_24;
  array<unsigned_char,_4UL> aStack_20;
  bool auto_split;
  array<unsigned_char,_4UL> ecf_id;
  array<unsigned_char,_4UL> esf_id;
  array<unsigned_char,_4UL> enf_id;
  array<unsigned_char,_4UL> eif_id;
  bool quiet_local;
  World *this_local;
  
  esf_id._M_elems = *&(this->eif->rid)._M_elems;
  ecf_id._M_elems = *&(this->enf->rid)._M_elems;
  aStack_20._M_elems = *&(this->esf->rid)._M_elems;
  local_24._M_elems = *&(this->ecf->rid)._M_elems;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"AutoSplitPubFiles",&local_49);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_48);
  bVar2 = util::variant::operator_cast_to_bool(pmVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = this->eif;
  local_25 = bVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"EIF",&local_a1);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_a0);
  util::variant::operator_cast_to_string(&local_80,pmVar3);
  EIF::Read(this_00,&local_80,(bool)(local_25 & 1));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  this_01 = this->enf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"ENF",&local_e9);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_e8);
  util::variant::operator_cast_to_string(&local_c8,pmVar3);
  ENF::Read(this_01,&local_c8,(bool)(local_25 & 1));
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  this_02 = this->esf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"ESF",&local_131);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_130);
  util::variant::operator_cast_to_string(&local_110,pmVar3);
  ESF::Read(this_02,&local_110,(bool)(local_25 & 1));
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  this_03 = this->ecf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"ECF",(allocator<char> *)((long)&__range3 + 7));
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_178);
  util::variant::operator_cast_to_string(&local_158,pmVar3);
  ECF::Read(this_03,&local_158,(bool)(local_25 & 1));
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  bVar2 = std::operator!=(&esf_id,&this->eif->rid);
  if (((((bVar2) || (bVar2 = std::operator!=(&ecf_id,&this->enf->rid), bVar2)) ||
       (bVar2 = std::operator!=(&stack0xffffffffffffffe0,&this->esf->rid), bVar2)) ||
      (bVar2 = std::operator!=(&local_24,&this->ecf->rid), bVar2)) && (!quiet)) {
    __end3 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
    character = (Character *)
                std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                       *)&character), bVar2) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                ::operator*(&__end3);
      pCVar1 = *ppCVar4;
      local_1a0 = pCVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c0,"The server has been reloaded, please log out and in again.",
                 (allocator<char> *)((long)&current_npcs + 7));
      (*(pCVar1->super_Command_Source)._vptr_Command_Source[5])(pCVar1,local_1c0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&current_npcs + 7));
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end3);
    }
  }
  local_1e0 = std::
              vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
              ::size(&this->npc_data);
  __new_size = std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::size
                         (&this->enf->data);
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::resize(&this->npc_data,__new_size);
  for (; local_1e0 < __new_size; local_1e0 = local_1e0 + 1) {
    this_04 = std::
              vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
              ::operator[](&this->npc_data,local_1e0);
    this_05 = std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>::operator->(this_04);
    NPC_Data::LoadShopDrop(this_05);
  }
  return;
}

Assistant:

void World::ReloadPub(bool quiet)
{
	auto eif_id = this->eif->rid;
	auto enf_id = this->enf->rid;
	auto esf_id = this->esf->rid;
	auto ecf_id = this->ecf->rid;

	bool auto_split = this->config["AutoSplitPubFiles"];

	this->eif->Read(this->config["EIF"], auto_split);
	this->enf->Read(this->config["ENF"], auto_split);
	this->esf->Read(this->config["ESF"], auto_split);
	this->ecf->Read(this->config["ECF"], auto_split);

	if (eif_id != this->eif->rid || enf_id != this->enf->rid
	 || esf_id != this->esf->rid || ecf_id != this->ecf->rid)
	{
		if (!quiet)
		{
			UTIL_FOREACH(this->characters, character)
			{
				character->ServerMsg("The server has been reloaded, please log out and in again.");
			}
		}
	}

	std::size_t current_npcs = this->npc_data.size();
	std::size_t new_npcs = this->enf->data.size();

	this->npc_data.resize(new_npcs);

	for (std::size_t i = current_npcs; i < new_npcs; ++i)
	{
		npc_data[i]->LoadShopDrop();
	}
}